

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

bool BattleWithLandlord::GenCarry
               (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *count
               ,uint len,int carry,
               vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
               *res)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> index
  ;
  int in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  uint x_3;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms_1;
  uint i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vi_1;
  pair<const_char,_int> *x_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *__range3_1;
  vector<char,_std::allocator<char>_> v_1;
  uint x_1;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vi;
  pair<const_char,_int> *x;
  const_iterator __end2;
  const_iterator __begin2;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *__range2;
  vector<char,_std::allocator<char>_> v;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *in_stack_fffffffffffffe08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  iterator in_stack_fffffffffffffe28;
  unsigned_long in_stack_fffffffffffffe30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_180;
  uint local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  reference local_128;
  _Self local_120;
  _Self local_118;
  undefined8 local_110;
  vector<char,_std::allocator<char>_> local_108;
  uint *local_f0;
  _Base_ptr local_e8;
  _Base_ptr local_e0;
  uint local_d4;
  uint *local_d0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  uint local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  int local_68;
  reference local_58;
  _Self local_50;
  _Self local_48;
  undefined8 local_40;
  vector<char,_std::allocator<char>_> local_38;
  int local_18;
  uint local_14;
  undefined8 local_10;
  byte local_1;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  std::
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
           *)0x122942);
  if (local_18 == 2) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x12295d);
    local_40 = local_10;
    local_48._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::begin
                   (in_stack_fffffffffffffe08);
    local_50._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                   (in_stack_fffffffffffffe08);
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      local_58 = std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator*
                           ((_Rb_tree_const_iterator<std::pair<const_char,_int>_> *)
                            in_stack_fffffffffffffe10);
      if (1 < local_58->second) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (value_type *)in_stack_fffffffffffffe18);
      }
      std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_char,_int>_> *)in_stack_fffffffffffffe10);
    }
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_38);
    if (sVar2 < local_14) {
      local_1 = 0;
      local_68 = 1;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x122a59);
      for (local_84 = 0; local_84 < local_14; local_84 = local_84 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (value_type_conflict1 *)in_stack_fffffffffffffe18);
      }
      do {
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x122ac8);
        local_c0 = &local_80;
        local_c8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffe08);
        local_d0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffe08);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffffe10,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffffe08), bVar1) {
          puVar3 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_c8);
          local_d4 = *puVar3;
          std::vector<char,_std::allocator<char>_>::operator[](&local_38,(ulong)local_d4);
          local_e0 = (_Base_ptr)
                     std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                               (in_stack_fffffffffffffe18,(value_type *)in_stack_fffffffffffffe10);
          std::vector<char,_std::allocator<char>_>::operator[](&local_38,(ulong)local_d4);
          local_e8 = (_Base_ptr)
                     std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                               (in_stack_fffffffffffffe18,(value_type *)in_stack_fffffffffffffe10);
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&local_c8);
        }
        std::
        vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                    in_stack_fffffffffffffe18);
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x122c06);
        this = &local_80;
        local_f0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffe08);
        index._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
        std::vector<char,_std::allocator<char>_>::size(&local_38);
        bVar1 = next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                          (index,(unsigned_long)this,
                           (unsigned_long)in_stack_fffffffffffffe28._M_node);
      } while (bVar1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      local_68 = 0;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
joined_r0x00122fa7:
    if (local_68 != 0) goto LAB_00122fd5;
  }
  else if (local_18 == 1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x122cdb);
    local_110 = local_10;
    local_118._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::begin
                   (in_stack_fffffffffffffe08);
    local_120._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                   (in_stack_fffffffffffffe08);
    while (bVar1 = std::operator!=(&local_118,&local_120), bVar1) {
      local_128 = std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator*
                            ((_Rb_tree_const_iterator<std::pair<const_char,_int>_> *)
                             in_stack_fffffffffffffe10);
      if (local_128->second != 0) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (value_type *)in_stack_fffffffffffffe18);
      }
      std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_char,_int>_> *)in_stack_fffffffffffffe10);
    }
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_108);
    if (sVar2 < local_14) {
      local_1 = 0;
      local_68 = 1;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x122dd7);
      for (local_144 = 0; local_144 < local_14; local_144 = local_144 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (value_type_conflict1 *)in_stack_fffffffffffffe18);
      }
      do {
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x122e46);
        local_180 = &local_140;
        local_188._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffe08);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe08)
        ;
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffffe10,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffffe08), bVar1) {
          puVar3 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_188);
          std::vector<char,_std::allocator<char>_>::operator[](&local_108,(ulong)*puVar3);
          in_stack_fffffffffffffe28 =
               std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                         (in_stack_fffffffffffffe18,(value_type *)in_stack_fffffffffffffe10);
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&local_188);
        }
        std::
        vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                    in_stack_fffffffffffffe18);
        std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
                  ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x122f20);
        in_stack_fffffffffffffe10 = &local_140;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe08)
        ;
        in_stack_fffffffffffffe18 =
             (value_type *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       (in_stack_fffffffffffffe10);
        std::vector<char,_std::allocator<char>_>::size(&local_108);
        in_stack_fffffffffffffe27 =
             next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                       (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                        (unsigned_long)in_stack_fffffffffffffe28._M_node);
      } while ((bool)in_stack_fffffffffffffe27);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      local_68 = 0;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    goto joined_r0x00122fa7;
  }
  local_1 = 1;
LAB_00122fd5:
  return (bool)(local_1 & 1);
}

Assistant:

bool BattleWithLandlord::GenCarry(const map<byte, int> &count, unsigned len, int carry, vector<multiset<byte> > &res) {
    res.clear();
    if (carry == 2) {
        vector<byte> v;
        for (auto &x: count) {
            if (x.second > 1) {
                v.push_back(x.first);
            }
        }
        if (v.size() < len) return false;
        vector<unsigned> vi;
        for (unsigned i = 0; i < len; ++i) {
            vi.push_back(i);
        }
        do {
            multiset<byte> ms;
            for (auto x: vi) {
                ms.insert(v[x]);
                ms.insert(v[x]);
            }
            res.push_back(ms);
        } while (next_combination(vi.begin(),vi.size(),v.size()));
    } else if (carry == 1) {
        vector<byte> v;
        for (auto &x: count) {
#ifdef DIFF_CARRY
            if (x.second)
                v.push_back(x.first);
#else
            for (int i = 0; i < x.second; ++i) {
                v.push_back(x.first);
            }
#endif
        }
        if (v.size() < len) return false;
        vector<unsigned> vi;
        for (unsigned i = 0; i < len; ++i) {
            vi.push_back(i);
        }
        do {
            multiset<byte> ms;
            for (auto x: vi) {
                ms.insert(v[x]);
            }
            res.push_back(ms);
        } while(next_combination(vi.begin(),vi.size(),v.size()));
        // bug remain, need to drop repeated items
        // fix it later
        // this is the reason why stl do not contain next_combination
    }
    return true;
}